

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall
helics::LogManager::addLoggingCLI(LogManager *this,shared_ptr<helics::helicsCLI11App> *app)

{
  Option_group *pOVar1;
  App *pAVar2;
  App *this_00;
  filter_fn_t *filter_fn_2;
  Option *pOVar3;
  Option *this_01;
  long in_RDI;
  Option_group *logging_group;
  Validator *in_stack_fffffffffffff318;
  Option *in_stack_fffffffffffff320;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffff328;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff330;
  allocator<char> *in_stack_fffffffffffff350;
  allocator<char> *__a;
  char *in_stack_fffffffffffff358;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff360;
  string *in_stack_fffffffffffff370;
  string *psVar4;
  Validator *in_stack_fffffffffffff378;
  Validator *Validator;
  Option *in_stack_fffffffffffff380;
  filter_fn_t *in_stack_fffffffffffff388;
  filter_fn_t *in_stack_fffffffffffff390;
  filter_fn_t *filter_fn_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  **in_stack_fffffffffffff398;
  IsMember *in_stack_fffffffffffff3a0;
  CheckedTransformer *this_02;
  string *in_stack_fffffffffffff3e0;
  string *in_stack_fffffffffffff3e8;
  App *in_stack_fffffffffffff3f0;
  string *in_stack_fffffffffffff408;
  string *flag_description;
  function<void_(long)> *in_stack_fffffffffffff410;
  function<void_(long)> *function;
  string *in_stack_fffffffffffff418;
  string *flag_name;
  App *in_stack_fffffffffffff420;
  string *in_stack_fffffffffffff428;
  string *option_description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff430;
  int *variable;
  string *in_stack_fffffffffffff438;
  App *in_stack_fffffffffffff440;
  string *in_stack_fffffffffffff448;
  App *in_stack_fffffffffffff450;
  allocator<char> local_b01 [73];
  char *local_ab8;
  undefined8 local_ab0;
  undefined1 local_aa8 [39];
  allocator<char> local_a81;
  format_args in_stack_fffffffffffff580;
  string_view in_stack_fffffffffffff590;
  char local_a60 [32];
  allocator<char> local_a40 [32];
  undefined1 *local_a20;
  allocator<char> local_941 [33];
  Validator local_920 [2];
  filter_fn_t local_801;
  undefined1 local_7d9 [137];
  undefined1 *local_750;
  allocator<char> local_671 [97];
  undefined1 *local_610;
  allocator<char> local_531 [40];
  allocator<char> local_509 [40];
  string local_4e1;
  string local_4c0;
  function<void_(long)> local_4a0;
  undefined1 *local_480;
  string local_3a1;
  string local_380;
  int local_360 [8];
  undefined1 *local_340;
  allocator<char> local_261 [40];
  allocator<char> local_239 [80];
  allocator<char> local_1e9 [40];
  allocator<char> local_1c1 [40];
  allocator<char> local_199 [40];
  allocator<char> local_171 [80];
  allocator<char> local_121 [40];
  allocator<char> local_f9 [56];
  allocator<char> local_c1 [33];
  Option_group *local_a0;
  size_t local_88 [2];
  undefined8 local_78;
  size_t *local_70;
  char *local_68;
  undefined8 uStack_60;
  size_t *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  size_t local_30;
  size_t *local_28;
  size_t *local_20;
  undefined8 *local_18;
  size_t local_10;
  size_t *local_8;
  
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x5c5ed4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  pOVar1 = CLI::App::add_option_group<CLI::Option_group>
                     (in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0)
  ;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_f9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_c1);
  local_a0 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  std::function<void(long)>::
  function<helics::LogManager::addLoggingCLI(std::shared_ptr<helics::helicsCLI11App>&)::__0,void>
            ((function<void_(long)> *)in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  CLI::App::add_flag_function
            (in_stack_fffffffffffff420,in_stack_fffffffffffff418,in_stack_fffffffffffff410,
             in_stack_fffffffffffff408);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_171);
  CLI::std::function<void_(long)>::~function((function<void_(long)> *)0x5c6096);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_fffffffffffff440,in_stack_fffffffffffff438,in_stack_fffffffffffff430,
             in_stack_fffffffffffff428);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_1c1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  std::function<void(int_const&)>::
  function<helics::LogManager::addLoggingCLI(std::shared_ptr<helics::helicsCLI11App>&)::__1,void>
            ((function<void_(const_int_&)> *)in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  CLI::App::add_option_function<int>
            (in_stack_fffffffffffff450,in_stack_fffffffffffff448,
             (function<void_(const_int_&)> *)in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  pAVar2 = (App *)CLI::Option::envname
                            (in_stack_fffffffffffff320,(string *)in_stack_fffffffffffff318);
  local_340 = gLogLevelMap_abi_cxx11_;
  variable = local_360;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  psVar4 = &local_380;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
             in_stack_fffffffffffff390,in_stack_fffffffffffff388);
  CLI::Validator::Validator((Validator *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  option_description = &local_3a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  this_00 = (App *)CLI::Option::transform
                             (in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                              in_stack_fffffffffffff370);
  local_480 = gLogLevelMap_abi_cxx11_;
  function = &local_4a0;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  flag_name = &local_4c0;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,in_stack_fffffffffffff390,
             in_stack_fffffffffffff388);
  CLI::Validator::Validator((Validator *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  flag_description = &local_4e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  CLI::Option::transform
            (in_stack_fffffffffffff380,in_stack_fffffffffffff378,in_stack_fffffffffffff370);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  CLI::Validator::~Validator((Validator *)in_stack_fffffffffffff320);
  CLI::IsMember::~IsMember((IsMember *)0x5c6499);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c64a6);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c64b3);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  CLI::Validator::~Validator((Validator *)in_stack_fffffffffffff320);
  CLI::CheckedTransformer::~CheckedTransformer((CheckedTransformer *)0x5c64e7);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c64f4);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6501);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_261);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_239);
  CLI::std::function<void_(const_int_&)>::~function((function<void_(const_int_&)> *)0x5c6542);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>(pAVar2,psVar4,variable,option_description)
  ;
  local_610 = gLogLevelMap_abi_cxx11_;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
             in_stack_fffffffffffff390,in_stack_fffffffffffff388);
  CLI::Validator::Validator((Validator *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  CLI::Option::transform
            (in_stack_fffffffffffff380,in_stack_fffffffffffff378,in_stack_fffffffffffff370);
  local_750 = gLogLevelMap_abi_cxx11_;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            (in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,in_stack_fffffffffffff390,
             in_stack_fffffffffffff388);
  CLI::Validator::Validator((Validator *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  CLI::Option::transform
            (in_stack_fffffffffffff380,in_stack_fffffffffffff378,in_stack_fffffffffffff370);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator((allocator<char> *)(local_7d9 + 0x28));
  CLI::Validator::~Validator((Validator *)in_stack_fffffffffffff320);
  CLI::IsMember::~IsMember((IsMember *)0x5c67fb);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6808);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6815);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_671);
  CLI::Validator::~Validator((Validator *)in_stack_fffffffffffff320);
  CLI::CheckedTransformer::~CheckedTransformer((CheckedTransformer *)0x5c6849);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6856);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6863);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_531);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_509);
  this_02 = (CheckedTransformer *)local_7d9;
  pOVar1 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  filter_fn_2 = (filter_fn_t *)(in_RDI + 0x24);
  filter_fn_1 = &local_801;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  pOVar3 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar2,psVar4,variable,option_description);
  local_920[0].name_._M_dataplus._M_p = gLogLevelMap_abi_cxx11_;
  psVar4 = (string *)&local_920[0].func_;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  Validator = local_920;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            (this_02,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      **)pOVar1,filter_fn_1,filter_fn_2);
  CLI::Validator::Validator((Validator *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff360,in_stack_fffffffffffff358,in_stack_fffffffffffff350);
  this_01 = CLI::Option::transform(pOVar3,Validator,psVar4);
  local_a20 = gLogLevelMap_abi_cxx11_;
  __a = local_a40;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  __s = local_a60;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(&)(std::__cxx11::string),void>
            (in_stack_fffffffffffff330,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_fffffffffffff328);
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)this_02,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              **)pOVar1,filter_fn_1,filter_fn_2);
  CLI::Validator::Validator((Validator *)in_stack_fffffffffffff320,in_stack_fffffffffffff318);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,__s,__a);
  CLI::Option::transform(pOVar3,Validator,psVar4);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(&local_a81);
  CLI::Validator::~Validator((Validator *)in_stack_fffffffffffff320);
  CLI::IsMember::~IsMember((IsMember *)0x5c6afa);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6b07);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6b14);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_941);
  CLI::Validator::~Validator((Validator *)in_stack_fffffffffffff320);
  CLI::CheckedTransformer::~CheckedTransformer((CheckedTransformer *)0x5c6b48);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6b55);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)0x5c6b62);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator((allocator<char> *)local_7d9);
  local_ab8 = "--logbuffer{{{}}}";
  local_ab0 = 0x11;
  local_38 = local_aa8;
  local_48 = "--logbuffer{{{}}}";
  uStack_40 = 0x11;
  local_50 = &LogBuffer::cDefaultBufferSize;
  local_68 = "--logbuffer{{{}}}";
  uStack_60 = 0x11;
  local_30 = 10;
  local_28 = local_88;
  local_88[0] = 10;
  local_18 = &local_78;
  local_78 = 4;
  local_20 = local_28;
  local_10 = local_30;
  local_8 = local_28;
  local_70 = local_28;
  ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff590,in_stack_fffffffffffff580);
  std::function<void(long)>::
  function<helics::LogManager::addLoggingCLI(std::shared_ptr<helics::helicsCLI11App>&)::__2,void>
            ((function<void_(long)> *)in_stack_fffffffffffff330,in_stack_fffffffffffff328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,__s,__a);
  pAVar2 = (App *)CLI::App::add_flag_function(this_00,flag_name,function,flag_description);
  pOVar3 = CLI::Option::expected((Option *)pAVar2,0,1);
  CLI::Option::multi_option_policy(pOVar3,TakeLast);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::allocator<char>::~allocator(local_b01);
  CLI::std::function<void_(long)>::~function((function<void_(long)> *)0x5c6d86);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff320);
  std::function<void()>::
  function<helics::LogManager::addLoggingCLI(std::shared_ptr<helics::helicsCLI11App>&)::__3,void>
            ((function<void_()> *)pAVar2,(anon_class_8_1_8991fb9c *)pOVar3);
  CLI::App::callback(pAVar2,(function<void_()> *)pOVar3);
  CLI::std::function<void_()>::~function((function<void_()> *)0x5c6de6);
  return;
}

Assistant:

void LogManager::addLoggingCLI(std::shared_ptr<helicsCLI11App>& app)
{
    auto* logging_group =
        app->add_option_group("logging", "Options related to file and message logging");
    logging_group->add_flag_function(
        "--force_logging_flush",
        [this](int64_t val) {
            if (val > 0) {
                forceLoggingFlush = true;
            }
        },
        "flush the log after every message");
    logging_group->add_option("--logfile", logFile, "the file to log the messages to");
    logging_group
        ->add_option_function<int>(
            "--loglevel",
            [this](int val) { setLogLevel(val); },
            "the level at which to log, the higher this is set the more gets logged; set to \"no_print\" for no logging")
        ->envname("HELICS_BROKER_LOG_LEVEL")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));

    logging_group
        ->add_option("--fileloglevel",
                     fileLogLevel,
                     "the level at which messages get sent to the file")
        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_option("--consoleloglevel",
                     consoleLogLevel,
                     "the level at which messages get sent to the file")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_flag_function(
            fmt::format("--logbuffer{{{}}}", LogBuffer::cDefaultBufferSize),
            [this](std::int64_t val) { mLogBuffer.resize(val); },
            "optionally specify the size of the circular buffer for storing log messages for later retrieval ")
        ->expected(0, 1)
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast);
    logging_group->callback([this]() { updateMaxLogLevel(); });
}